

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTextureBorderClampTests.cpp
# Opt level: O0

bool deqp::gles31::Functional::anon_unknown_1::isDepthFormat(deUint32 format,DepthStencilMode mode)

{
  bool bVar1;
  TextureFormat TVar2;
  undefined4 local_1c;
  TextureFormat fmt;
  DepthStencilMode mode_local;
  deUint32 format_local;
  
  if ((((format == 0x1909) || (format == 0x190a)) || (format == 0x1906)) || (format == 0x80e1)) {
    mode_local._3_1_ = MODE_DEPTH >> 0x18;
  }
  else {
    bVar1 = glu::isCompressedFormat(format);
    if (bVar1) {
      mode_local._3_1_ = MODE_DEPTH >> 0x18;
    }
    else {
      TVar2 = glu::mapGLInternalFormat(format);
      local_1c = TVar2.order;
      if (local_1c == D) {
        mode_local._3_1_ = 1;
      }
      else if ((local_1c == DS) && (mode == MODE_DEPTH)) {
        mode_local._3_1_ = 1;
      }
      else {
        mode_local._3_1_ = MODE_DEPTH >> 0x18;
      }
    }
  }
  return (bool)mode_local._3_1_;
}

Assistant:

bool isDepthFormat (deUint32 format, tcu::Sampler::DepthStencilMode mode)
{
	if (format == GL_LUMINANCE || format == GL_LUMINANCE_ALPHA || format == GL_ALPHA || format == GL_BGRA)
	{
		// Unsized formats are a special case
		return false;
	}
	else if (glu::isCompressedFormat(format))
	{
		// no known compressed depth formats
		return false;
	}
	else
	{
		const tcu::TextureFormat fmt = glu::mapGLInternalFormat(format);

		if (fmt.order == tcu::TextureFormat::D)
		{
			DE_ASSERT(mode == tcu::Sampler::MODE_DEPTH);
			return true;
		}
		else if (fmt.order == tcu::TextureFormat::DS && mode == tcu::Sampler::MODE_DEPTH)
			return true;
		else
			return false;
	}
}